

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void __thiscall cppcms::filters::jsescape::operator()(jsescape *this,ostream *out)

{
  undefined **local_f0 [4];
  undefined1 *local_d0;
  undefined1 *local_c8;
  streambuf **local_c0;
  undefined1 local_b0 [128];
  streambuf *local_30;
  ostream *poStack_28;
  undefined4 local_20;
  undefined1 local_1a;
  
  std::streambuf::streambuf
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)local_f0);
  local_c0 = &local_30;
  local_d0 = local_b0;
  local_30 = (streambuf *)0x0;
  poStack_28 = (ostream *)0x0;
  local_f0[0] = &PTR__filterbuf_002b6cc8;
  local_20 = 0x3030755c;
  local_1a = 0;
  local_c8 = local_d0;
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::release
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)local_f0);
  poStack_28 = out;
  local_30 = (streambuf *)std::ios::rdbuf((streambuf *)(out + *(long *)(*(long *)out + -0x18)));
  (*(this->obj_).to_stream_)(out,(this->obj_).ptr_);
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::release
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)local_f0);
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::~filterbuf
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)local_f0);
  return;
}

Assistant:

void jsescape::operator()(std::ostream &out) const
	{
		jsescape_buf sb;
		sb.steal(out);
		obj_(out);
		sb.release();
	}